

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

matrix3d *
tinyusdz::inverse_pxr(matrix3d *__return_storage_ptr__,matrix3d *m,double *detp,double eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar1 = m->m[0][0];
  dVar2 = m->m[0][1];
  dVar3 = m->m[0][2];
  dVar4 = m->m[1][0];
  dVar5 = m->m[1][1];
  dVar10 = m->m[1][2];
  dVar7 = m->m[2][0];
  dVar8 = m->m[2][1];
  dVar6 = m->m[2][2];
  dVar11 = dVar10 * -dVar1;
  dVar12 = dVar1 * dVar5 * dVar6 +
           ((dVar11 * dVar8 +
            dVar3 * dVar4 * dVar8 + (dVar2 * dVar10 * dVar7 - dVar5 * dVar3 * dVar7)) -
           dVar4 * dVar2 * dVar6);
  if (detp != (double *)0x0) {
    *detp = dVar12;
  }
  if (ABS(dVar12) <= eps) {
    __return_storage_ptr__->m[1][0] = 0.0;
    __return_storage_ptr__->m[0][1] = 0.0;
    __return_storage_ptr__->m[0][2] = 0.0;
    __return_storage_ptr__->m[2][1] = 0.0;
    __return_storage_ptr__->m[1][2] = 0.0;
    __return_storage_ptr__->m[2][0] = 0.0;
    dVar9 = 3.4028234663852886e+38;
    dVar10 = 3.4028234663852886e+38;
    dVar13 = 3.4028234663852886e+38;
  }
  else {
    dVar12 = 1.0 / dVar12;
    dVar13 = (-dVar2 * dVar4 + dVar1 * dVar5) * dVar12;
    __return_storage_ptr__->m[0][1] = (dVar6 * -dVar2 + dVar8 * dVar3) * dVar12;
    __return_storage_ptr__->m[0][2] = (dVar2 * dVar10 + -dVar3 * dVar5) * dVar12;
    __return_storage_ptr__->m[1][0] = (dVar10 * dVar7 - dVar6 * dVar4) * dVar12;
    dVar9 = (-dVar3 * dVar7 + dVar6 * dVar1) * dVar12;
    dVar10 = (-dVar10 * dVar8 + dVar6 * dVar5) * dVar12;
    __return_storage_ptr__->m[1][2] = (dVar11 + dVar4 * dVar3) * dVar12;
    __return_storage_ptr__->m[2][0] = (dVar4 * dVar8 + dVar7 * -dVar5) * dVar12;
    __return_storage_ptr__->m[2][1] = (dVar2 * dVar7 + -dVar1 * dVar8) * dVar12;
  }
  __return_storage_ptr__->m[0][0] = dVar10;
  __return_storage_ptr__->m[1][1] = dVar9;
  __return_storage_ptr__->m[2][2] = dVar13;
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d inverse_pxr(const value::matrix3d &m, double *detp,
                            double eps) {
  double a00, a01, a02, a10, a11, a12, a20, a21, a22;
  double det, rcp;

  a00 = m.m[0][0];
  a01 = m.m[0][1];
  a02 = m.m[0][2];
  a10 = m.m[1][0];
  a11 = m.m[1][1];
  a12 = m.m[1][2];
  a20 = m.m[2][0];
  a21 = m.m[2][1];
  a22 = m.m[2][2];
  det = -(a02 * a11 * a20) + a01 * a12 * a20 + a02 * a10 * a21 -
        a00 * a12 * a21 - a01 * a10 * a22 + a00 * a11 * a22;

  if (detp) {
    *detp = det;
  }

  value::matrix3d inv;

  if (std::fabs(det) > eps) {
    rcp = 1.0 / det;
    inv.m[0][0] = (-(a12 * a21) + a11 * a22) * rcp;
    inv.m[0][1] = (a02 * a21 - a01 * a22) * rcp;
    inv.m[0][2] = (-(a02 * a11) + a01 * a12) * rcp;
    inv.m[1][0] = (a12 * a20 - a10 * a22) * rcp;
    inv.m[1][1] = (-(a02 * a20) + a00 * a22) * rcp;
    inv.m[1][2] = (a02 * a10 - a00 * a12) * rcp;
    inv.m[2][0] = (-(a11 * a20) + a10 * a21) * rcp;
    inv.m[2][1] = (a01 * a20 - a00 * a21) * rcp;
    inv.m[2][2] = (-(a01 * a10) + a00 * a11) * rcp;

  } else {
    inv = value::matrix3d::identity();
    // scale = FLT_MAX
    inv.m[0][0] = double((std::numeric_limits<float>::max)());
    inv.m[1][1] = double((std::numeric_limits<float>::max)());
    inv.m[2][2] = double((std::numeric_limits<float>::max)());
  }

  return inv;
}